

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O2

void __thiscall
btGeneric6DofSpring2Constraint::testAngularLimitMotor
          (btGeneric6DofSpring2Constraint *this,int axis_index)

{
  btScalar test_value;
  
  test_value = btAdjustAngleToLimits
                         ((this->m_calculatedAxisAngleDiff).m_floats[axis_index],
                          this->m_angularLimits[axis_index].m_loLimit,
                          this->m_angularLimits[axis_index].m_hiLimit);
  this->m_angularLimits[axis_index].m_currentPosition = test_value;
  btRotationalLimitMotor2::testLimitValue(this->m_angularLimits + axis_index,test_value);
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::testAngularLimitMotor(int axis_index)
{
	btScalar angle = m_calculatedAxisAngleDiff[axis_index];
	angle = btAdjustAngleToLimits(angle, m_angularLimits[axis_index].m_loLimit, m_angularLimits[axis_index].m_hiLimit);
	m_angularLimits[axis_index].m_currentPosition = angle;
	m_angularLimits[axis_index].testLimitValue(angle);
}